

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testInterval.cpp
# Opt level: O0

void anon_unknown.dwarf_5b268::testConstructors<short>(char *type)

{
  short sVar1;
  ostream *poVar2;
  char *in_RDI;
  bool bVar3;
  Interval<short> b_3;
  short p1_1;
  short p0_1;
  Interval<short> b_2;
  short p1;
  short p0;
  Interval<short> b_1;
  short p;
  Interval<short> b;
  Interval<short> local_22;
  short local_1e;
  short local_1c;
  Interval<short> local_1a;
  short local_16;
  short local_14;
  Interval<short> local_12;
  short local_e;
  short local_c;
  short local_a;
  char *local_8;
  
  local_8 = in_RDI;
  poVar2 = std::operator<<((ostream *)&std::cout,"    constructors for type ");
  poVar2 = std::operator<<(poVar2,local_8);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  Imath_3_2::Interval<short>::Interval((Interval<short> *)0x16a632);
  sVar1 = std::numeric_limits<short>::max();
  bVar3 = false;
  if (local_c == sVar1) {
    sVar1 = std::numeric_limits<short>::lowest();
    bVar3 = local_a == sVar1;
  }
  if (!bVar3) {
    __assert_fail("b.min == T (std::numeric_limits<T>::max ()) && b.max == T (std::numeric_limits<T>::lowest ())"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterval.cpp"
                  ,0x29,"void (anonymous namespace)::testConstructors(const char *) [T = short]");
  }
  local_e = 0x2a;
  Imath_3_2::Interval<short>::Interval(&local_12,&local_e);
  if (local_12.min != local_e || local_12.max != local_e) {
    __assert_fail("b.min == p && b.max == p",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterval.cpp"
                  ,0x32,"void (anonymous namespace)::testConstructors(const char *) [T = short]");
  }
  local_14 = 0x2a;
  local_16 = 0x29a;
  Imath_3_2::Interval<short>::Interval(&local_1a,&local_14,&local_16);
  if (local_1a.min != local_14 || local_1a.max != local_16) {
    __assert_fail("b.min == p0 && b.max == p1",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterval.cpp"
                  ,0x3c,"void (anonymous namespace)::testConstructors(const char *) [T = short]");
  }
  local_1c = 0x29a;
  local_1e = 0x2a;
  Imath_3_2::Interval<short>::Interval(&local_22,&local_1c,&local_1e);
  if (local_22.min != local_1c || local_22.max != local_1e) {
    __assert_fail("b.min == p0 && b.max == p1",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterval.cpp"
                  ,0x43,"void (anonymous namespace)::testConstructors(const char *) [T = short]");
  }
  return;
}

Assistant:

static void
testConstructors (const char* type)
{
    cout << "    constructors for type " << type << endl;

    //
    // Empty
    //
    {
        IMATH_INTERNAL_NAMESPACE::Interval<T> b;
        assert (
            b.min == T (std::numeric_limits<T>::max ()) &&
            b.max == T (std::numeric_limits<T>::lowest ()));
    }

    //
    // Single point
    //
    {
        T                                     p (42);
        IMATH_INTERNAL_NAMESPACE::Interval<T> b (p);
        assert (b.min == p && b.max == p);
    }

    //
    // Min and max
    //
    {
        T                                     p0 (42);
        T                                     p1 (666);
        IMATH_INTERNAL_NAMESPACE::Interval<T> b (p0, p1);
        assert (b.min == p0 && b.max == p1);
    }

    {
        T                                     p0 (666);
        T                                     p1 (42);
        IMATH_INTERNAL_NAMESPACE::Interval<T> b (p0, p1);
        assert (b.min == p0 && b.max == p1);
    }
}